

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O2

int fe_mfcc_to_float(fe_t *fe,mfcc_t **input,float32 **output,int32 nframes)

{
  uint uVar1;
  ulong uVar3;
  ulong uVar2;
  
  uVar1 = (uint)fe->feature_dimension * nframes;
  uVar2 = (ulong)uVar1;
  if (input != output) {
    uVar3 = 0;
    if ((int)uVar1 < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      (*output)[uVar3] = (*input)[uVar3];
    }
  }
  return (int)uVar2;
}

Assistant:

int32
fe_mfcc_to_float(fe_t * fe,
                 mfcc_t ** input, float32 ** output, int32 nframes)
{
    int32 i;

#ifndef FIXED_POINT
    if ((void *) input == (void *) output)
        return nframes * fe->feature_dimension;
#endif
    for (i = 0; i < nframes * fe->feature_dimension; ++i)
        output[0][i] = MFCC2FLOAT(input[0][i]);

    return i;
}